

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O2

void strdump(char *e,char *p,wchar_t ewidth,wchar_t utf8)

{
  char cVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  size_t sVar5;
  byte *pbVar6;
  uint uVar7;
  char *pcVar8;
  uint uVar9;
  char *pcVar10;
  long lStack_50;
  
  logprintf("      %*s = ",(ulong)(uint)ewidth,e);
  if (p == (char *)0x0) {
    pcVar10 = "NULL\n";
  }
  else {
    logprintf("\"");
    pcVar10 = p;
LAB_00102dc3:
    while (cVar1 = *pcVar10, cVar1 != '\0') {
      pcVar10 = pcVar10 + 1;
      switch(cVar1) {
      case '\a':
        pcVar8 = "\\a";
        break;
      case '\b':
        pcVar8 = "\\b";
        break;
      default:
        goto switchD_00102ddd_caseD_9;
      case '\n':
        pcVar8 = "\\n";
        break;
      case '\r':
        pcVar8 = "\\r";
      }
      logprintf(pcVar8);
    }
    logprintf("\"");
    sVar5 = strlen(p);
    logprintf(" (length %d)",sVar5 & 0xffffffff);
    pcVar10 = "\n";
    if (utf8 != L'\0') {
      sVar5 = strlen(p);
      logprintf(" [");
      uVar7 = 0;
      pbVar6 = (byte *)p;
      for (; sVar5 != 0; sVar5 = sVar5 - lStack_50) {
        bVar2 = *pbVar6;
        if (bVar2 == 0) break;
        bVar3 = _utf8_to_unicode_utf8_count[bVar2];
        if ((sVar5 < (ulong)(long)(char)bVar3) || (3 < bVar3 - 1)) {
LAB_00103008:
          logprintf("]");
          logprintf(" (count %d",(ulong)uVar7);
          logprintf(",unknown %zu bytes",sVar5);
          goto LAB_00103057;
        }
        switch((uint)bVar3) {
        case 1:
          uVar4 = bVar2 & 0x7f;
          lStack_50 = 1;
          break;
        case 2:
          if ((pbVar6[1] & 0xffffffc0) != 0x80) goto LAB_00103008;
          uVar4 = pbVar6[1] & 0x3f | (bVar2 & 0x1f) << 6;
          lStack_50 = 2;
          break;
        case 3:
          if (((((int)(char)pbVar6[1] & 0xc0U) != 0x80) || ((pbVar6[2] & 0xffffffc0) != 0x80)) ||
             (uVar4 = ((int)(char)pbVar6[1] & 0x3fU) << 6 | (bVar2 & 0xf) << 0xc, uVar4 < 0x800))
          goto LAB_00103008;
          uVar4 = pbVar6[2] & 0x3f | uVar4;
          lStack_50 = 3;
          break;
        case 4:
          if ((((3 < sVar5) && (((int)(char)pbVar6[1] & 0xc0U) == 0x80)) &&
              (((int)(char)pbVar6[2] & 0xc0U) == 0x80)) && ((pbVar6[3] & 0xffffffc0) == 0x80)) {
            uVar9 = (bVar2 & 7) * 0x40000;
            uVar4 = ((int)(char)pbVar6[1] & 0x3fU) * 0x1000;
            if (0xffefffff < (uVar4 + uVar9) - 0x110000) {
              uVar4 = pbVar6[3] & 0x3f | ((int)(char)pbVar6[2] & 0x3fU) << 6 | uVar4 | uVar9;
              lStack_50 = 4;
              break;
            }
          }
          goto LAB_00103008;
        }
        if (pbVar6 != (byte *)p) {
          logprintf(" ");
        }
        logprintf("%04X",(ulong)uVar4);
        pbVar6 = pbVar6 + lStack_50;
        uVar7 = uVar7 + 1;
      }
      logprintf("]");
      logprintf(" (count %d",(ulong)uVar7);
LAB_00103057:
      logprintf(")");
      pcVar10 = "\n";
    }
  }
  logprintf(pcVar10);
  return;
switchD_00102ddd_caseD_9:
  if ((byte)(cVar1 - 0x20U) < 0x5f) {
    pcVar8 = "%c";
  }
  else {
    pcVar8 = "\\x%02X";
  }
  logprintf(pcVar8);
  goto LAB_00102dc3;
}

Assistant:

static void strdump(const char *e, const char *p, int ewidth, int utf8)
{
	const char *q = p;

	logprintf("      %*s = ", ewidth, e);
	if (p == NULL) {
		logprintf("NULL\n");
		return;
	}
	logprintf("\"");
	while (*p != '\0') {
		unsigned int c = 0xff & *p++;
		switch (c) {
		case '\a': logprintf("\\a"); break;
		case '\b': logprintf("\\b"); break;
		case '\n': logprintf("\\n"); break;
		case '\r': logprintf("\\r"); break;
		default:
			if (c >= 32 && c < 127)
				logprintf("%c", (int)c);
			else
				logprintf("\\x%02X", c);
		}
	}
	logprintf("\"");
	logprintf(" (length %d)", q == NULL ? -1 : (int)strlen(q));

	/*
	 * If the current string is UTF-8, dump its code points.
	 */
	if (utf8) {
		size_t len;
		uint32_t uc;
		int n;
		int cnt = 0;

		p = q;
		len = strlen(p);
		logprintf(" [");
		while ((n = _utf8_to_unicode(&uc, p, len)) > 0) {
			if (p != q)
				logprintf(" ");
			logprintf("%04X", uc);
			p += n;
			len -= n;
			cnt++;
		}
		logprintf("]");
		logprintf(" (count %d", cnt);
		if (n < 0) {
			logprintf(",unknown %zu bytes", len);
		}
		logprintf(")");

	}
	logprintf("\n");
}